

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.c
# Opt level: O2

void glfwEventRelease(GLFWEvent *event)

{
  if (event != (GLFWEvent *)0x0) {
    if (GLFWEventPool == (GLFWEvent *)0x0 && GLFWEventPoolSize != 0) {
      __assert_fail("GLFWEventPoolSize == 0 || GLFWEventPool",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/creationix[P]lit-glfw/wrapper.c"
                    ,0x17,"void glfwEventRelease(GLFWEvent *)");
    }
    if (9 < GLFWEventPoolSize) {
      free(event);
      return;
    }
    event->next = GLFWEventPool;
    GLFWEventPoolSize = GLFWEventPoolSize + 1;
    GLFWEventPool = event;
  }
  return;
}

Assistant:

void glfwEventRelease(GLFWEvent* event) {
  if (!event) return;
  assert(GLFWEventPoolSize == 0 || GLFWEventPool);
  if (GLFWEventPoolSize < GLFWEventPoolMaxSize) {
    event->next = GLFWEventPool;
    GLFWEventPool = event;
    GLFWEventPoolSize++;
  }
  else {
    // The recycling pool is large enough, let's free this one.
    free(event);
  }
}